

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void Catch::enforceNotReservedTag(string *tag,SourceLineInfo *_lineInfo)

{
  SpecialProperties SVar1;
  int iVar2;
  ostream *poVar3;
  Colour local_1a;
  Colour local_19 [7];
  Colour colourGuard;
  Colour colourGuard_1;
  
  SVar1 = parseSpecialTag(tag);
  if ((SVar1 == None) && (tag->_M_string_length != 0)) {
    iVar2 = isalnum((int)*(tag->_M_dataplus)._M_p);
    if (iVar2 == 0) {
      local_1a.m_moved = false;
      Colour::use(Red);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Tag name [",10);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(tag->_M_dataplus)._M_p,tag->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] not allowed.\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"Tag names starting with non alpha-numeric characters are reserved\n",0x42);
      Colour::~Colour(&local_1a);
      local_19[0].m_moved = false;
      Colour::use(FileName);
      operator<<((ostream *)&std::cerr,_lineInfo);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      Colour::~Colour(local_19);
      exit(1);
    }
  }
  return;
}

Assistant:

inline void enforceNotReservedTag( std::string const& tag, SourceLineInfo const& _lineInfo ) {
        if( isReservedTag( tag ) ) {
            {
                Colour colourGuard( Colour::Red );
                Catch::cerr()
                    << "Tag name [" << tag << "] not allowed.\n"
                    << "Tag names starting with non alpha-numeric characters are reserved\n";
            }
            {
                Colour colourGuard( Colour::FileName );
                Catch::cerr() << _lineInfo << std::endl;
            }
            exit(1);
        }
    }